

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

void __thiscall
cimg_library::CImg<unsigned_int>::CImg
          (CImg<unsigned_int> *this,CImg<unsigned_int> *img,bool is_shared)

{
  undefined1 auVar1 [16];
  ulongT uVar2;
  ulong uVar3;
  uint *puVar4;
  size_t siz;
  bool is_shared_local;
  CImg<unsigned_int> *img_local;
  CImg<unsigned_int> *this_local;
  
  uVar2 = size(img);
  if ((img->_data == (uint *)0x0) || (uVar2 == 0)) {
    this->_spectrum = 0;
    this->_depth = 0;
    this->_height = 0;
    this->_width = 0;
    this->_is_shared = false;
    this->_data = (uint *)0x0;
  }
  else {
    this->_width = img->_width;
    this->_height = img->_height;
    this->_depth = img->_depth;
    this->_spectrum = img->_spectrum;
    this->_is_shared = is_shared;
    if ((this->_is_shared & 1U) == 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar2;
      uVar3 = SUB168(auVar1 * ZEXT816(4),0);
      if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      puVar4 = (uint *)operator_new__(uVar3);
      this->_data = puVar4;
      memcpy(this->_data,img->_data,uVar2 << 2);
    }
    else {
      this->_data = img->_data;
    }
  }
  return;
}

Assistant:

CImg(const CImg<T>& img, const bool is_shared) {
      const size_t siz = (size_t)img.size();
      if (img._data && siz) {
        _width = img._width; _height = img._height; _depth = img._depth; _spectrum = img._spectrum;
        _is_shared = is_shared;
        if (_is_shared) _data = const_cast<T*>(img._data);
        else {
          try { _data = new T[siz]; } catch (...) {
            _width = _height = _depth = _spectrum = 0; _data = 0;
            throw CImgInstanceException(_cimg_instance
                                        "CImg(): Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                        cimg_instance,
                                        cimg::strbuffersize(sizeof(T)*img._width*img._height*img._depth*img._spectrum),
                                        img._width,img._height,img._depth,img._spectrum);
          }
          std::memcpy(_data,img._data,siz*sizeof(T));
        }
      } else { _width = _height = _depth = _spectrum = 0; _is_shared = false; _data = 0; }
    }